

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3MultiValuesEnd(Parse *pParse,Select *pVal)

{
  SrcList *pSVar1;
  Vdbe *pVVar2;
  Parse *pPVar3;
  Op *pOVar4;
  
  if (((pVal != (Select *)0x0) && (pSVar1 = pVal->pSrc, 0 < pSVar1->nSrc)) &&
     ((pSVar1->a[0].fg.field_0x1 & 4) != 0)) {
    pVVar2 = pParse->pVdbe;
    sqlite3VdbeAddOp3(pVVar2,0x44,(pSVar1->a[0].u4.pSubq)->regReturn,0,0);
    pPVar3 = pVVar2->pParse;
    pPVar3->nTempReg = '\0';
    pPVar3->nRangeReg = 0;
    pVVar2 = pParse->pVdbe;
    if (pVVar2->db->mallocFailed == '\0') {
      pOVar4 = pVVar2->aOp + (long)(pSVar1->a[0].u4.pSubq)->addrFillSub + -1;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar4->p2 = pVVar2->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MultiValuesEnd(Parse *pParse, Select *pVal){
  if( ALWAYS(pVal) && pVal->pSrc->nSrc>0 ){
    SrcItem *pItem = &pVal->pSrc->a[0];
    assert( (pItem->fg.isSubquery && pItem->u4.pSubq!=0) || pParse->nErr );
    if( pItem->fg.isSubquery ){
      sqlite3VdbeEndCoroutine(pParse->pVdbe, pItem->u4.pSubq->regReturn);
      sqlite3VdbeJumpHere(pParse->pVdbe, pItem->u4.pSubq->addrFillSub - 1);
    }
  }
}